

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep.cc
# Opt level: O2

void __thiscall p2t::Sweep::~Sweep(Sweep *this)

{
  pointer ppNVar1;
  size_t i;
  ulong uVar2;
  
  for (uVar2 = 0;
      ppNVar1 = (this->nodes_).super__Vector_base<p2t::Node_*,_std::allocator<p2t::Node_*>_>._M_impl
                .super__Vector_impl_data._M_start,
      uVar2 < (ulong)((long)(this->nodes_).
                            super__Vector_base<p2t::Node_*,_std::allocator<p2t::Node_*>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)ppNVar1 >> 3);
      uVar2 = uVar2 + 1) {
    operator_delete(ppNVar1[uVar2]);
  }
  std::_Vector_base<p2t::Node_*,_std::allocator<p2t::Node_*>_>::~_Vector_base
            ((_Vector_base<p2t::Node_*,_std::allocator<p2t::Node_*>_> *)this);
  return;
}

Assistant:

Sweep::~Sweep() {

    // Clean up memory
    for(size_t i = 0; i < nodes_.size(); i++) {
        delete nodes_[i];
    }

}